

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_delta_lflevel(AV1_COMMON *cm,MACROBLOCKD *xd,int lf_id,int delta_lflevel,
                        int delta_lf_multi,aom_writer *w)

{
  int in_ECX;
  int in_R8D;
  undefined8 in_R9;
  FRAME_CONTEXT *ec_ctx;
  int smallval;
  int thr;
  int rem_bits;
  int abs;
  int sign;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar1;
  int local_4c;
  
  local_4c = in_ECX;
  if (in_ECX < 0) {
    local_4c = -in_ECX;
  }
  if (in_R8D == 0) {
    in_stack_ffffffffffffff94 = local_4c;
    if (2 < local_4c) {
      in_stack_ffffffffffffff94 = 3;
    }
    aom_write_symbol((aom_writer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (int)((ulong)in_R9 >> 0x20),
                     (aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
  }
  else {
    iVar1 = local_4c;
    if (2 < local_4c) {
      iVar1 = 3;
    }
    aom_write_symbol((aom_writer *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
  }
  if (2 < local_4c) {
    get_msb(local_4c - 1);
    aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  if (0 < local_4c) {
    aom_write_bit((aom_writer *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c);
  }
  return;
}

Assistant:

static inline void write_delta_lflevel(const AV1_COMMON *cm,
                                       const MACROBLOCKD *xd, int lf_id,
                                       int delta_lflevel, int delta_lf_multi,
                                       aom_writer *w) {
  int sign = delta_lflevel < 0;
  int abs = sign ? -delta_lflevel : delta_lflevel;
  int rem_bits, thr;
  int smallval = abs < DELTA_LF_SMALL ? 1 : 0;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  (void)cm;

  if (delta_lf_multi) {
    assert(lf_id >= 0 && lf_id < (av1_num_planes(cm) > 1 ? FRAME_LF_COUNT
                                                         : FRAME_LF_COUNT - 2));
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL),
                     ec_ctx->delta_lf_multi_cdf[lf_id], DELTA_LF_PROBS + 1);
  } else {
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL), ec_ctx->delta_lf_cdf,
                     DELTA_LF_PROBS + 1);
  }

  if (!smallval) {
    rem_bits = get_msb(abs - 1);
    thr = (1 << rem_bits) + 1;
    aom_write_literal(w, rem_bits - 1, 3);
    aom_write_literal(w, abs - thr, rem_bits);
  }
  if (abs > 0) {
    aom_write_bit(w, sign);
  }
}